

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O2

void start_checkpoint(storage_t *st)

{
  fdb_status fVar1;
  checkpoint_t *__s;
  size_t keylen;
  fdb_doc *local_38;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  local_38 = (fdb_doc *)0x0;
  fVar1 = fdb_begin_transaction(st->records,'\x02');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
            ,0x13c);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                  ,0x13c,"void start_checkpoint(storage_t *)");
  }
  __s = create_checkpoint(st,5);
  keylen = strlen(__s->key);
  fdb_doc_create(&local_38,__s,keylen,(void *)0x0,0,__s,0x430);
  save_tx(st,local_38->key,local_38->keylen,5);
  fVar1 = fdb_set(st->chk,local_38);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    free(__s);
    fdb_doc_free(local_38);
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
          ,0x146);
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                ,0x146,"void start_checkpoint(storage_t *)");
}

Assistant:

void start_checkpoint(storage_t *st)
{
    TEST_INIT();

    checkpoint_t *chk;
    fdb_status status;
    fdb_doc *chk_doc = NULL;

    status = fdb_begin_transaction(st->records, FDB_ISOLATION_READ_COMMITTED);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // create opening checkpoint doc
    chk = create_checkpoint(st, START_CHECKPOINT);
    fdb_doc_create(&chk_doc, chk->key, strlen(chk->key),
                   NULL, 0, chk, sizeof(checkpoint_t));

    // save checkpoint transaction
    save_tx(st, chk_doc->key, chk_doc->keylen, START_CHECKPOINT);
    status = fdb_set(st->chk, chk_doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);


#ifdef __DEBUG_E2E
    char rbuf[256];
    sprintf(rbuf, "start checkpoint[seqno:%" _F64 "]",chk->seqnum_all);
    TEST_RESULT(rbuf);
#endif

    free(chk);
    fdb_doc_free(chk_doc);
    chk_doc=NULL;
    chk=NULL;


}